

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

int buffer_append_va(Buffer *buffer,char *fmt,__va_list_tag *va)

{
  uint uVar1;
  int iVar2;
  char *__s;
  va_list ap;
  char scratch [256];
  undefined8 local_158;
  void *pvStack_150;
  void *local_148;
  char local_138 [264];
  
  local_148 = va->reg_save_area;
  local_158._0_4_ = va->gp_offset;
  local_158._4_4_ = va->fp_offset;
  pvStack_150 = va->overflow_arg_area;
  uVar1 = vsnprintf(local_138,0x100,fmt,&local_158);
  if (uVar1 == 0) {
    iVar2 = 1;
  }
  else if (uVar1 < 0x100) {
    iVar2 = buffer_append(buffer,local_138,(long)(int)uVar1);
  }
  else {
    __s = (char *)(*buffer->m)(uVar1 + 1,buffer->d);
    if (__s == (char *)0x0) {
      iVar2 = 0;
    }
    else {
      local_148 = va->reg_save_area;
      local_158._0_4_ = va->gp_offset;
      local_158._4_4_ = va->fp_offset;
      pvStack_150 = va->overflow_arg_area;
      vsnprintf(__s,(long)(int)(uVar1 + 1),fmt,&local_158);
      iVar2 = buffer_append(buffer,__s,(long)(int)uVar1);
      (*buffer->f)(__s,buffer->d);
    }
  }
  return iVar2;
}

Assistant:

int buffer_append_va(Buffer *buffer, const char *fmt, va_list va)
{
    char scratch[256];

    va_list ap;
    va_copy(ap, va);
    const int len = vsnprintf(scratch, sizeof (scratch), fmt, ap);
    va_end(ap);

    // If we overflowed our scratch buffer, heap allocate and try again.

    if (len == 0)
        return 1;  // nothing to do.
    else if (len < sizeof (scratch))
        return buffer_append(buffer, scratch, len);

    char *buf = (char *) buffer->m(len + 1, buffer->d);
    if (buf == NULL)
        return 0;
    va_copy(ap, va);
    vsnprintf(buf, len + 1, fmt, ap);  // rebuild it.
    va_end(ap);
    const int retval = buffer_append(buffer, buf, len);
    buffer->f(buf, buffer->d);
    return retval;
}